

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

LogicalCountExpr mp::internal::ExprTypes::UncheckedCast<mp::LogicalCountExpr>(Expr e)

{
  AssertionFailure *this;
  
  if (*(int *)e.super_ExprBase.impl_ - 0x3bU < 6) {
    return (LogicalCountExpr)(Impl *)e.super_ExprBase.impl_;
  }
  this = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this,"invalid cast");
  __cxa_throw(this,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

expr::Kind kind() const { return kind_; }